

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

void __thiscall soul::StructuralParser::parseStaticAssert(StructuralParser *this)

{
  Allocator *context_00;
  ModuleBase *pMVar1;
  StaticAssertion *o;
  pool_ref<soul::AST::Expression> *in_R8;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args_00;
  Allocator *local_70;
  pool_ref<soul::AST::Expression> *local_68;
  pool_ref<soul::AST::StaticAssertion> local_60;
  char *local_58;
  CommaSeparatedList *local_50;
  CommaSeparatedList *args;
  char *local_40;
  undefined1 local_28 [8];
  Context context;
  StructuralParser *this_local;
  
  context.parentScope = (Scope *)this;
  getContext((Context *)local_28,this);
  local_40 = (char *)Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                     ::skip(&this->super_SOULTokeniser);
  args = (CommaSeparatedList *)0x573c42;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x573c42);
  local_50 = parseCommaSeparatedListOfExpressions(this,false,false);
  local_58 = ";";
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x54c9e0);
  pMVar1 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  context_00 = this->allocator;
  ArrayView<soul::pool_ref<soul::AST::Expression>>::
  ArrayView<soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,4ul>>
            ((ArrayView<soul::pool_ref<soul::AST::Expression>> *)&local_70,&local_50->items);
  args_00.e = in_R8;
  args_00.s = local_68;
  o = ASTUtilities::createStaticAssertion
                ((ASTUtilities *)local_28,(Context *)context_00,local_70,args_00);
  pool_ref<soul::AST::StaticAssertion>::pool_ref<soul::AST::StaticAssertion,void>(&local_60,o);
  std::
  vector<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
  ::push_back(&pMVar1->staticAssertions,&local_60);
  pool_ref<soul::AST::StaticAssertion>::~pool_ref(&local_60);
  AST::Context::~Context((Context *)local_28);
  return;
}

Assistant:

void parseStaticAssert()
    {
        auto context = getContext();
        skip();
        expect (Operator::openParen);
        auto& args = parseCommaSeparatedListOfExpressions (false, false);
        expect (Operator::semicolon);
        module->staticAssertions.push_back (ASTUtilities::createStaticAssertion (context, allocator, args.items));
    }